

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O1

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this)

{
  *(undefined ***)&this->field_0x8 = &PTR__Einsum_005e0640;
  if (*(undefined1 **)&this->field_0xf0 != &this->field_0x100) {
    operator_delete(*(undefined1 **)&this->field_0xf0,*(long *)&this->field_0x100 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->field_0xd8);
  Layer::~Layer((Layer *)&this->field_0x8);
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }